

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O2

size_t __thiscall
s2coding::EncodedUintVector<unsigned_long_long>::lower_bound<3>
          (EncodedUintVector<unsigned_long_long> *this,unsigned_long_long target)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  sVar3 = 0;
  uVar2 = (ulong)this->size_;
  while (uVar1 = uVar2, sVar3 < uVar1) {
    uVar2 = sVar3 + uVar1 >> 1;
    if (CONCAT21(*(undefined2 *)(this->data_ + uVar2 * 3 + 1),this->data_[uVar2 * 3]) < target) {
      sVar3 = uVar2 + 1;
      uVar2 = uVar1;
    }
  }
  return sVar3;
}

Assistant:

inline size_t EncodedUintVector<T>::lower_bound(T target) const {
  size_t lo = 0, hi = size_;
  while (lo < hi) {
    size_t mid = (lo + hi) >> 1;
    T value = GetUintWithLength<T>(data_ + mid * length, length);
    if (value < target) {
      lo = mid + 1;
    } else {
      hi = mid;
    }
  }
  return lo;
}